

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall
fasttext::Args::parseArgs
          (Args *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  char *pcVar6;
  ostream *poVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  float fVar8;
  out_of_range anon_var_0;
  int ai;
  string command;
  size_t *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  string *in_stack_fffffffffffffbf8;
  Args *in_stack_fffffffffffffc00;
  Args *in_stack_fffffffffffffc98;
  Args *in_stack_fffffffffffffcc8;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  int local_40;
  string local_30 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RSI,1);
  std::__cxx11::string::string(local_30,(string *)pvVar3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                          (char *)in_stack_fffffffffffffbe8);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0xa4) = 3;
    *(undefined4 *)(in_RDI + 0xa0) = 3;
    *(undefined4 *)(in_RDI + 0x90) = 1;
    *(undefined4 *)(in_RDI + 0xac) = 0;
    *(undefined4 *)(in_RDI + 0xb0) = 0;
    *(undefined8 *)(in_RDI + 0x78) = 0x3fb999999999999a;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                            (char *)in_stack_fffffffffffffbe8);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0xa4) = 1;
    }
  }
  local_40 = 2;
  while( true ) {
    uVar4 = (ulong)local_40;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_10);
    if (sVar5 <= uVar4) {
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        if ((*(int *)(in_RDI + 0x9c) < 2) &&
           ((*(int *)(in_RDI + 0xb0) == 0 && (bVar1 = hasAutotune((Args *)0x195d00), !bVar1)))) {
          *(undefined4 *)(in_RDI + 0xa8) = 0;
        }
        std::__cxx11::string::~string(local_30);
        return;
      }
      poVar7 = std::operator<<((ostream *)&std::cerr,"Empty input or output path.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      printHelp((Args *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      exit(1);
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_10,(long)local_40);
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    if (*pcVar6 != '-') {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Provided argument without a dash! Usage:");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      printHelp((Args *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      exit(1);
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_10,(long)local_40);
    std::__cxx11::string::substr((ulong)local_60,(ulong)pvVar3);
    setManual(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    std::__cxx11::string::~string(local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_10,(long)local_40);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                            (char *)in_stack_fffffffffffffbe8);
    if (bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_10,(long)local_40);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                            (char *)in_stack_fffffffffffffbe8);
    if (bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                    (size_type)in_stack_fffffffffffffbe8);
      std::__cxx11::string::string(local_80,(string *)pvVar3);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x38),local_80);
      std::__cxx11::string::~string(local_80);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_10,(long)local_40);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                              (char *)in_stack_fffffffffffffbe8);
      if (bVar1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                      (size_type)in_stack_fffffffffffffbe8);
        std::__cxx11::string::string(local_a0,(string *)pvVar3);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x58),local_a0);
        std::__cxx11::string::~string(local_a0);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_10,(long)local_40);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                                (char *)in_stack_fffffffffffffbe8);
        if (bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (size_type)in_stack_fffffffffffffbe8);
          fVar8 = std::__cxx11::stof((string *)
                                     CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                                     in_stack_fffffffffffffbe8);
          *(double *)(in_RDI + 0x78) = (double)fVar8;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_10,(long)local_40);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                                  (char *)in_stack_fffffffffffffbe8);
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 (size_type)in_stack_fffffffffffffbe8);
            iVar2 = std::__cxx11::stoi((string *)
                                       CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0)
                                       ,in_stack_fffffffffffffbe8,0);
            *(int *)(in_RDI + 0x80) = iVar2;
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_10,(long)local_40);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0)
                                    ,(char *)in_stack_fffffffffffffbe8);
            if (bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                   (size_type)in_stack_fffffffffffffbe8);
              iVar2 = std::__cxx11::stoi((string *)
                                         CONCAT17(in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0),
                                         in_stack_fffffffffffffbe8,0);
              *(int *)(in_RDI + 0x84) = iVar2;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_10,(long)local_40);
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0),
                                      (char *)in_stack_fffffffffffffbe8);
              if (bVar1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                     (size_type)in_stack_fffffffffffffbe8);
                iVar2 = std::__cxx11::stoi((string *)
                                           CONCAT17(in_stack_fffffffffffffbf7,
                                                    in_stack_fffffffffffffbf0),
                                           in_stack_fffffffffffffbe8,0);
                *(int *)(in_RDI + 0x88) = iVar2;
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_10,(long)local_40);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffbf7,
                                                    in_stack_fffffffffffffbf0),
                                        (char *)in_stack_fffffffffffffbe8);
                if (bVar1) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                       (size_type)in_stack_fffffffffffffbe8);
                  iVar2 = std::__cxx11::stoi((string *)
                                             CONCAT17(in_stack_fffffffffffffbf7,
                                                      in_stack_fffffffffffffbf0),
                                             in_stack_fffffffffffffbe8,0);
                  *(int *)(in_RDI + 0x8c) = iVar2;
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_10,(long)local_40);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffbf7,
                                                      in_stack_fffffffffffffbf0),
                                          (char *)in_stack_fffffffffffffbe8);
                  if (bVar1) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                         (size_type)in_stack_fffffffffffffbe8);
                    iVar2 = std::__cxx11::stoi((string *)
                                               CONCAT17(in_stack_fffffffffffffbf7,
                                                        in_stack_fffffffffffffbf0),
                                               in_stack_fffffffffffffbe8,0);
                    *(int *)(in_RDI + 0x90) = iVar2;
                  }
                  else {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_10,(long)local_40);
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffbf7,
                                                        in_stack_fffffffffffffbf0),
                                            (char *)in_stack_fffffffffffffbe8);
                    if (bVar1) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                           (size_type)in_stack_fffffffffffffbe8);
                      iVar2 = std::__cxx11::stoi((string *)
                                                 CONCAT17(in_stack_fffffffffffffbf7,
                                                          in_stack_fffffffffffffbf0),
                                                 in_stack_fffffffffffffbe8,0);
                      *(int *)(in_RDI + 0x94) = iVar2;
                    }
                    else {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](local_10,(long)local_40);
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffbf7,
                                                          in_stack_fffffffffffffbf0),
                                              (char *)in_stack_fffffffffffffbe8);
                      if (bVar1) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                             (size_type)in_stack_fffffffffffffbe8);
                        iVar2 = std::__cxx11::stoi((string *)
                                                   CONCAT17(in_stack_fffffffffffffbf7,
                                                            in_stack_fffffffffffffbf0),
                                                   in_stack_fffffffffffffbe8,0);
                        *(int *)(in_RDI + 0x98) = iVar2;
                      }
                      else {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_10,(long)local_40);
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffffbf7,
                                                            in_stack_fffffffffffffbf0),
                                                (char *)in_stack_fffffffffffffbe8);
                        if (bVar1) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                               (size_type)in_stack_fffffffffffffbe8);
                          iVar2 = std::__cxx11::stoi((string *)
                                                     CONCAT17(in_stack_fffffffffffffbf7,
                                                              in_stack_fffffffffffffbf0),
                                                     in_stack_fffffffffffffbe8,0);
                          *(int *)(in_RDI + 0x9c) = iVar2;
                        }
                        else {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_10,(long)local_40);
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                          if (bVar1) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                                 (size_type)in_stack_fffffffffffffbe8);
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                            if (bVar1) {
                              *(undefined4 *)(in_RDI + 0xa0) = 1;
                            }
                            else {
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                                   (size_type)in_stack_fffffffffffffbe8);
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                              if (bVar1) {
                                *(undefined4 *)(in_RDI + 0xa0) = 2;
                              }
                              else {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0
                                                ),(size_type)in_stack_fffffffffffffbe8);
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                if (bVar1) {
                                  *(undefined4 *)(in_RDI + 0xa0) = 3;
                                }
                                else {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)CONCAT17(in_stack_fffffffffffffbf7,
                                                   in_stack_fffffffffffffbf0),
                                       (size_type)in_stack_fffffffffffffbe8);
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                  if (!bVar1) {
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)CONCAT17(in_stack_fffffffffffffbf7,
                                                     in_stack_fffffffffffffbf0),
                                         (size_type)in_stack_fffffffffffffbe8);
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                    if (!bVar1) {
                                      poVar7 = std::operator<<((ostream *)&std::cerr,
                                                               "Unknown loss: ");
                                      pvVar3 = std::
                                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                      poVar7 = std::operator<<(poVar7,(string *)pvVar3);
                                      std::ostream::operator<<
                                                (poVar7,std::endl<char,std::char_traits<char>>);
                                      printHelp((Args *)CONCAT17(in_stack_fffffffffffffbf7,
                                                                 in_stack_fffffffffffffbf0));
                                      exit(1);
                                    }
                                  }
                                  *(undefined4 *)(in_RDI + 0xa0) = 4;
                                }
                              }
                            }
                          }
                          else {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](local_10,(long)local_40);
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                            if (bVar1) {
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                                   (size_type)in_stack_fffffffffffffbe8);
                              iVar2 = std::__cxx11::stoi((string *)
                                                         CONCAT17(in_stack_fffffffffffffbf7,
                                                                  in_stack_fffffffffffffbf0),
                                                         in_stack_fffffffffffffbe8,0);
                              *(int *)(in_RDI + 0xa8) = iVar2;
                            }
                            else {
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](local_10,(long)local_40);
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                              if (bVar1) {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0
                                                ),(size_type)in_stack_fffffffffffffbe8);
                                iVar2 = std::__cxx11::stoi((string *)
                                                           CONCAT17(in_stack_fffffffffffffbf7,
                                                                    in_stack_fffffffffffffbf0),
                                                           in_stack_fffffffffffffbe8,0);
                                *(int *)(in_RDI + 0xac) = iVar2;
                              }
                              else {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](local_10,(long)local_40);
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                if (bVar1) {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)CONCAT17(in_stack_fffffffffffffbf7,
                                                   in_stack_fffffffffffffbf0),
                                       (size_type)in_stack_fffffffffffffbe8);
                                  iVar2 = std::__cxx11::stoi((string *)
                                                             CONCAT17(in_stack_fffffffffffffbf7,
                                                                      in_stack_fffffffffffffbf0),
                                                             in_stack_fffffffffffffbe8,0);
                                  *(int *)(in_RDI + 0xb0) = iVar2;
                                }
                                else {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[](local_10,(long)local_40);
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                  if (bVar1) {
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)CONCAT17(in_stack_fffffffffffffbf7,
                                                     in_stack_fffffffffffffbf0),
                                         (size_type)in_stack_fffffffffffffbe8);
                                    iVar2 = std::__cxx11::stoi((string *)
                                                               CONCAT17(in_stack_fffffffffffffbf7,
                                                                        in_stack_fffffffffffffbf0),
                                                               in_stack_fffffffffffffbe8,0);
                                    *(int *)(in_RDI + 0xb4) = iVar2;
                                  }
                                  else {
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_10,(long)local_40);
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                    if (bVar1) {
                                      in_stack_fffffffffffffcc8 =
                                           (Args *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                      fVar8 = std::__cxx11::stof((string *)
                                                                 CONCAT17(in_stack_fffffffffffffbf7,
                                                                          in_stack_fffffffffffffbf0)
                                                                 ,in_stack_fffffffffffffbe8);
                                      *(double *)(in_RDI + 0xb8) = (double)fVar8;
                                    }
                                    else {
                                      std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_10,(long)local_40);
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                      if (bVar1) {
                                        pvVar3 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                        std::__cxx11::string::string(local_c0,(string *)pvVar3);
                                        std::__cxx11::string::operator=
                                                  ((string *)(in_RDI + 0xc0),local_c0);
                                        std::__cxx11::string::~string(local_c0);
                                      }
                                      else {
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[](local_10,(long)local_40);
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                        if (bVar1) {
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)CONCAT17(in_stack_fffffffffffffbf7,
                                                           in_stack_fffffffffffffbf0),
                                               (size_type)in_stack_fffffffffffffbe8);
                                          iVar2 = std::__cxx11::stoi((string *)
                                                                     CONCAT17(
                                                  in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0),
                                                  in_stack_fffffffffffffbe8,0);
                                          *(int *)(in_RDI + 0xe0) = iVar2;
                                        }
                                        else {
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[](local_10,(long)local_40);
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                          if (bVar1) {
                                            in_stack_fffffffffffffc98 =
                                                 (Args *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                            std::__cxx11::string::string
                                                      (local_e0,(string *)in_stack_fffffffffffffc98)
                                            ;
                                            std::__cxx11::string::operator=
                                                      ((string *)(in_RDI + 0xe8),local_e0);
                                            std::__cxx11::string::~string(local_e0);
                                          }
                                          else {
                                            std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::operator[](local_10,(long)local_40);
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                            if (bVar1) {
                                              *(undefined1 *)(in_RDI + 0x108) = 1;
                                              local_40 = local_40 + -1;
                                            }
                                            else {
                                              std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::operator[](local_10,(long)local_40);
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                              if (bVar1) {
                                                std::
                                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                                iVar2 = std::__cxx11::stoi((string *)
                                                                           CONCAT17(
                                                  in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0),
                                                  in_stack_fffffffffffffbe8,0);
                                                *(int *)(in_RDI + 0x10c) = iVar2;
                                              }
                                              else {
                                                std::
                                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::operator[](local_10,(long)local_40);
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                if (bVar1) {
                                                  *(undefined1 *)(in_RDI + 0x112) = 1;
                                                  local_40 = local_40 + -1;
                                                }
                                                else {
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (bVar1) {
                                                    *(undefined1 *)(in_RDI + 0x111) = 1;
                                                    local_40 = local_40 + -1;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (bVar1) {
                                                    *(undefined1 *)(in_RDI + 0x110) = 1;
                                                    local_40 = local_40 + -1;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                             CONCAT17(
                                                  in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0),
                                                  in_stack_fffffffffffffbe8,0);
                                                  *(long *)(in_RDI + 0x118) = (long)iVar2;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                             CONCAT17(
                                                  in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0),
                                                  in_stack_fffffffffffffbe8,0);
                                                  *(long *)(in_RDI + 0x120) = (long)iVar2;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (bVar1) {
                                                    pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                                  std::__cxx11::string::string
                                                            (local_100,(string *)pvVar3);
                                                  std::__cxx11::string::operator=
                                                            ((string *)(in_RDI + 0x128),local_100);
                                                  std::__cxx11::string::~string(local_100);
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (bVar1) {
                                                    pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                                  std::__cxx11::string::string
                                                            (local_120,(string *)pvVar3);
                                                  std::__cxx11::string::operator=
                                                            ((string *)(in_RDI + 0x148),local_120);
                                                  std::__cxx11::string::~string(local_120);
                                                  getAutotuneMetric(in_stack_fffffffffffffcc8);
                                                  getAutotuneMetricLabel_abi_cxx11_
                                                            (in_stack_fffffffffffffc98);
                                                  std::__cxx11::string::~string(local_140);
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                             CONCAT17(
                                                  in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0),
                                                  in_stack_fffffffffffffbe8,0);
                                                  *(int *)(in_RDI + 0x168) = iVar2;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                             CONCAT17(
                                                  in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0),
                                                  in_stack_fffffffffffffbe8,0);
                                                  *(int *)(in_RDI + 0x16c) = iVar2;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (char *)in_stack_fffffffffffffbe8);
                                                  if (!bVar1) {
                                                    poVar7 = std::operator<<((ostream *)&std::cerr,
                                                                             "Unknown argument: ");
                                                    pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  poVar7 = std::operator<<(poVar7,(string *)pvVar3);
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  printHelp((Args *)CONCAT17(
                                                  in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0));
                                                  exit(1);
                                                  }
                                                  pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffbf7,
                                                             in_stack_fffffffffffffbf0),
                                                  (size_type)in_stack_fffffffffffffbe8);
                                                  std::__cxx11::string::string
                                                            (local_160,(string *)pvVar3);
                                                  std::__cxx11::string::operator=
                                                            ((string *)(in_RDI + 0x170),local_160);
                                                  std::__cxx11::string::~string(local_160);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_40 = local_40 + 2;
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,"Here is the help! Usage:");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  printHelp((Args *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  exit(1);
}

Assistant:

void Args::parseArgs(const std::vector<std::string>& args) {
  std::string command(args[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    minn = 0;
    maxn = 0;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  for (int ai = 2; ai < args.size(); ai += 2) {
    if (args[ai][0] != '-') {
      std::cerr << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    try {
      setManual(args[ai].substr(1));

      if (args[ai] == "-h") {
        std::cerr << "Here is the help! Usage:" << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      } else if (args[ai] == "-input") {
        input = std::string(args.at(ai + 1));
      } else if (args[ai] == "-output") {
        output = std::string(args.at(ai + 1));
      } else if (args[ai] == "-lr") {
        lr = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-lrUpdateRate") {
        lrUpdateRate = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dim") {
        dim = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-ws") {
        ws = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-epoch") {
        epoch = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCount") {
        minCount = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCountLabel") {
        minCountLabel = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-neg") {
        neg = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-wordNgrams") {
        wordNgrams = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-loss") {
        if (args.at(ai + 1) == "hs") {
          loss = loss_name::hs;
        } else if (args.at(ai + 1) == "ns") {
          loss = loss_name::ns;
        } else if (args.at(ai + 1) == "softmax") {
          loss = loss_name::softmax;
        } else if (
            args.at(ai + 1) == "one-vs-all" || args.at(ai + 1) == "ova") {
          loss = loss_name::ova;
        } else {
          std::cerr << "Unknown loss: " << args.at(ai + 1) << std::endl;
          printHelp();
          exit(EXIT_FAILURE);
        }
      } else if (args[ai] == "-bucket") {
        bucket = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minn") {
        minn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-maxn") {
        maxn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-thread") {
        thread = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-t") {
        t = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-label") {
        label = std::string(args.at(ai + 1));
      } else if (args[ai] == "-verbose") {
        verbose = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-pretrainedVectors") {
        pretrainedVectors = std::string(args.at(ai + 1));
      } else if (args[ai] == "-saveOutput") {
        saveOutput = true;
        ai--;
      } else if (args[ai] == "-seed") {
        seed = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-qnorm") {
        qnorm = true;
        ai--;
      } else if (args[ai] == "-retrain") {
        retrain = true;
        ai--;
      } else if (args[ai] == "-qout") {
        qout = true;
        ai--;
      } else if (args[ai] == "-cutoff") {
        cutoff = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dsub") {
        dsub = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-validation") {
        autotuneValidationFile = std::string(args.at(ai + 1));
      } else if (args[ai] == "-autotune-metric") {
        autotuneMetric = std::string(args.at(ai + 1));
        getAutotuneMetric(); // throws exception if not able to parse
        getAutotuneMetricLabel(); // throws exception if not able to parse
      } else if (args[ai] == "-autotune-predictions") {
        autotunePredictions = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-duration") {
        autotuneDuration = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-modelsize") {
        autotuneModelSize = std::string(args.at(ai + 1));
      } else {
        std::cerr << "Unknown argument: " << args[ai] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } catch (std::out_of_range) {
      std::cerr << args[ai] << " is missing an argument" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
  }
  if (input.empty() || output.empty()) {
    std::cerr << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
  if (wordNgrams <= 1 && maxn == 0 && !hasAutotune()) {
    bucket = 0;
  }
}